

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

QDebug QtPrivate::printSequentialContainer<QList<QWindow*>>
                 (QDebug *debug,char *which,QList<QWindow_*> *c)

{
  long lVar1;
  bool bVar2;
  const_iterator window;
  QDebug *o;
  QDebug *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  const_iterator end;
  const_iterator it;
  QDebugStateSaver saver;
  Stream *this;
  QDebug local_50;
  QDebug local_48;
  QWindow **local_40;
  QDebug in_stack_ffffffffffffffc8;
  QDebug local_30;
  QWindow **local_28;
  const_iterator local_20;
  QDebug *debug_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  debug_00 = (QDebug *)&DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&stack0xfffffffffffffff0,in_RSI);
  QDebug::nospace(in_RSI);
  QDebug::operator<<(in_RDX,(char *)in_stack_ffffffffffffffc8.stream);
  QDebug::operator<<((QDebug *)this,(char)((ulong)in_RDI >> 0x38));
  window = QList<QWindow_*>::begin((QList<QWindow_*> *)this);
  local_20.i = (QWindow **)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = (QWindow **)QList<QWindow_*>::end((QList<QWindow_*> *)this);
  local_20 = (const_iterator)local_28;
  bVar2 = QList<QWindow_*>::const_iterator::operator!=
                    ((const_iterator *)&stack0xffffffffffffffe8,(const_iterator)local_28);
  if (bVar2) {
    QDebug::QDebug((QDebug *)&stack0xffffffffffffffc8,in_RSI);
    QList<QWindow_*>::const_iterator::operator*((const_iterator *)&stack0xffffffffffffffe8);
    ::operator<<(debug_00,(QWindow *)window.i);
    QDebug::~QDebug(&local_30);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffc8);
    QList<QWindow_*>::const_iterator::operator++((const_iterator *)&stack0xffffffffffffffe8);
  }
  while( true ) {
    local_40 = local_20.i;
    bVar2 = QList<QWindow_*>::const_iterator::operator!=
                      ((const_iterator *)&stack0xffffffffffffffe8,local_20);
    if (!bVar2) break;
    o = QDebug::operator<<(in_RDX,(char *)in_stack_ffffffffffffffc8.stream);
    QDebug::QDebug(&local_50,o);
    QList<QWindow_*>::const_iterator::operator*((const_iterator *)&stack0xffffffffffffffe8);
    ::operator<<(debug_00,(QWindow *)window.i);
    QDebug::~QDebug(&local_48);
    QDebug::~QDebug(&local_50);
    QList<QWindow_*>::const_iterator::operator++((const_iterator *)&stack0xffffffffffffffe8);
  }
  QDebug::operator<<((QDebug *)this,(char)((ulong)in_RDI >> 0x38));
  QDebug::QDebug((QDebug *)this,(QDebug *)in_RDI);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&stack0xfffffffffffffff0);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QDebug)this;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}